

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O0

bool __thiscall Js::BigUInt::FResize(BigUInt *this,int32 clu)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint32 *local_28;
  uint32 *prglu;
  int32 clu_local;
  BigUInt *this_local;
  
  if (this == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x39,"(this)","this");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  AssertValid(this,false);
  if (this->m_cluMax < clu) {
    uVar2 = clu * 2;
    if (this->m_prglu == this->m_rgluInit) {
      if ((0x1fffffff < uVar2) ||
         (local_28 = (uint32 *)malloc((long)(int)uVar2 << 2), local_28 == (uint32 *)0x0)) {
        return false;
      }
      if (0 < this->m_clu) {
        js_memcpy_s(local_28,(long)(int)uVar2 << 2,this->m_prglu,(long)this->m_clu << 2);
      }
    }
    else {
      local_28 = (uint32 *)realloc(this->m_prglu,(long)(int)uVar2 << 2);
      if (local_28 == (uint32 *)0x0) {
        return false;
      }
    }
    this->m_prglu = local_28;
    this->m_cluMax = uVar2;
    if (this == (BigUInt *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x4e,"(this)","this");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    AssertValid(this,false);
  }
  return true;
}

Assistant:

bool BigUInt::FResize(int32 clu)
    {
        AssertBiNoVal(this);

        uint32 *prglu;

        if (clu <= m_cluMax)
            return true;

        clu += clu;
        if (m_prglu == m_rgluInit)
        {
            if ((INT_MAX / sizeof(uint32) < clu) || (NULL == (prglu = (uint32 *)malloc(clu * sizeof(uint32)))))
                return false;
            if (0 < m_clu)
                js_memcpy_s(prglu, clu * sizeof(uint32), m_prglu, m_clu * sizeof(uint32));
        }
        else if (NULL == (prglu = (uint32 *)realloc(m_prglu, clu * sizeof(uint32))))
            return false;

        m_prglu = prglu;
        m_cluMax = clu;

        AssertBiNoVal(this);
        return true;
    }